

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

bool __thiscall index::is_exist_index(index *this,wstring *word)

{
  bool bVar1;
  pointer ppVar2;
  wchar_t *pwVar3;
  ulong in_RSI;
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> iter;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  range;
  key_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  wchar_t wVar4;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> local_30;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  local_28;
  ulong local_18;
  
  local_18 = in_RSI;
  std::__cxx11::wstring::operator[](in_RSI);
  local_28 = std::
             unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
             ::equal_range((unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
                            *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
  local_30 = local_28.first.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
             _M_cur;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       &local_28.second.
                        super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>);
    if (!bVar1) {
      return false;
    }
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                        0x1173de);
    wVar4 = (ppVar2->second).value;
    pwVar3 = (wchar_t *)std::__cxx11::wstring::operator[](local_18);
    if (wVar4 == *pwVar3) break;
    std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
               CONCAT44(wVar4,in_stack_ffffffffffffffc0));
  }
  return true;
}

Assistant:

bool index::is_exist_index(const std::wstring& word)
{
    auto range = index_.equal_range(word[level_ - 1]);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == word[level_])
        {
            return true;
        }
    }
    return false;
}